

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_instance.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx::InstanceISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,InstanceISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  unsigned_long *puVar1;
  float *pfVar2;
  float geom_time_segments;
  undefined8 uVar3;
  BBox1f BVar4;
  AffineSpace3ff *pAVar5;
  long lVar6;
  PrimRefMB *pPVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  float fVar13;
  uint uVar14;
  undefined4 uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar27;
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar29;
  undefined1 auVar26 [16];
  float fVar30;
  float fVar34;
  float fVar35;
  undefined1 auVar31 [16];
  float fVar36;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  undefined1 auVar64 [16];
  float fVar67;
  float fVar68;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  LBBox3fa lbbox;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0.m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0.m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar20._8_4_ = 0x3f800000;
  auVar20._0_8_ = &DAT_3f8000003f800000;
  auVar20._12_4_ = 0x3f800000;
  uVar3 = vmovlps_avx(auVar20);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar3;
  (__return_storage_ptr__->time_range).upper = 0.0;
  BVar4 = (this->super_Instance).super_Geometry.time_range;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = BVar4.lower;
  auVar22._4_4_ = BVar4.upper;
  geom_time_segments = (this->super_Instance).super_Geometry.fnumTimeSegments;
  fVar55 = BVar4.lower;
  auVar20 = vmovshdup_avx(auVar22);
  fVar13 = auVar20._0_4_ - fVar55;
  auVar20 = ZEXT416((uint)(geom_time_segments * ((t0t1->lower - fVar55) / fVar13) * 1.0000002));
  auVar20 = vroundss_avx(auVar20,auVar20,9);
  auVar24._0_12_ = ZEXT812(0);
  auVar24._12_4_ = 0;
  auVar20 = vmaxss_avx(auVar24,auVar20);
  uVar14 = (uint)auVar20._0_4_;
  auVar20 = ZEXT416((uint)(geom_time_segments * ((t0t1->upper - fVar55) / fVar13) * 0.99999976));
  auVar20 = vroundss_avx(auVar20,auVar20,10);
  auVar20 = vminss_avx(auVar20,ZEXT416((uint)geom_time_segments));
  uVar16 = (uint)auVar20._0_4_;
  bVar18 = uVar16 < uVar14;
  if (uVar14 <= uVar16) {
    uVar17 = (ulong)(int)uVar14;
    pAVar5 = (this->super_Instance).local2world;
    lVar6 = *(long *)&(this->super_Instance).super_Geometry.field_0x58;
    fVar13 = (this->super_Instance).super_Geometry.time_range.lower;
    lVar19 = uVar17 << 6;
    auVar58._8_4_ = 0x5dccb9a2;
    auVar58._0_8_ = 0x5dccb9a25dccb9a2;
    auVar58._12_4_ = 0x5dccb9a2;
    do {
      if ((this->super_Instance).super_Geometry.field_8.field_0x1 == '\x01') {
        fVar55 = *(float *)((long)&(pAVar5->p).field_0 + lVar19 + 0xc);
        fVar23 = *(float *)((long)&(pAVar5->l).vx.field_0 + lVar19 + 0xc);
        fVar27 = *(float *)((long)&(pAVar5->l).vy.field_0 + lVar19 + 0xc);
        fVar30 = *(float *)((long)&(pAVar5->l).vz.field_0 + lVar19 + 0xc);
        fVar34 = fVar23 * fVar27 + fVar30 * fVar55;
        fVar59 = fVar23 * fVar27 - fVar30 * fVar55;
        fVar60 = fVar55 * fVar55 - fVar23 * fVar23;
        fVar61 = fVar23 * fVar30 - fVar27 * fVar55;
        fVar35 = fVar23 * fVar30 + fVar27 * fVar55;
        fVar36 = fVar27 * fVar30 + fVar23 * fVar55;
        fVar62 = fVar27 * fVar30 - fVar23 * fVar55;
        auVar20 = ZEXT416((uint)(fVar34 + fVar34));
        auVar20 = vshufps_avx(auVar20,auVar20,0);
        auVar22 = ZEXT416((uint)(fVar61 + fVar61));
        auVar22 = vshufps_avx(auVar22,auVar22,0);
        auVar24 = ZEXT416((uint)(-fVar30 * fVar30 +
                                -fVar27 * fVar27 + fVar55 * fVar55 + fVar23 * fVar23));
        auVar24 = vshufps_avx(auVar24,auVar24,0);
        fVar29 = auVar24._0_4_ * 1.0 + auVar22._0_4_ * 0.0 + auVar20._0_4_ * 0.0;
        fVar37 = auVar24._4_4_ * 0.0 + auVar22._4_4_ * 0.0 + auVar20._4_4_ * 1.0;
        fVar40 = auVar24._8_4_ * 0.0 + auVar22._8_4_ * 1.0 + auVar20._8_4_ * 0.0;
        fVar41 = auVar24._12_4_ * 0.0 + auVar22._12_4_ * 0.0 + auVar20._12_4_ * 0.0;
        auVar20 = ZEXT416((uint)(fVar59 + fVar59));
        auVar20 = vshufps_avx(auVar20,auVar20,0);
        auVar22 = ZEXT416((uint)(fVar27 * fVar27 + fVar60 + -fVar30 * fVar30));
        auVar22 = vshufps_avx(auVar22,auVar22,0);
        auVar24 = ZEXT416((uint)(fVar36 + fVar36));
        auVar24 = vshufps_avx(auVar24,auVar24,0);
        fVar42 = auVar20._0_4_ * 1.0 + auVar22._0_4_ * 0.0 + auVar24._0_4_ * 0.0;
        fVar43 = auVar20._4_4_ * 0.0 + auVar22._4_4_ * 1.0 + auVar24._4_4_ * 0.0;
        fVar47 = auVar20._8_4_ * 0.0 + auVar22._8_4_ * 0.0 + auVar24._8_4_ * 1.0;
        fVar48 = auVar20._12_4_ * 0.0 + auVar22._12_4_ * 0.0 + auVar24._12_4_ * 0.0;
        auVar20 = ZEXT416((uint)(fVar35 + fVar35));
        auVar20 = vshufps_avx(auVar20,auVar20,0);
        auVar22 = ZEXT416((uint)(fVar62 + fVar62));
        auVar22 = vshufps_avx(auVar22,auVar22,0);
        auVar24 = ZEXT416((uint)(fVar30 * fVar30 + fVar60 + -fVar27 * fVar27));
        auVar24 = vshufps_avx(auVar24,auVar24,0);
        fVar51 = auVar20._0_4_ * 1.0 + auVar22._0_4_ * 0.0 + auVar24._0_4_ * 0.0;
        fVar53 = auVar20._4_4_ * 0.0 + auVar22._4_4_ * 1.0 + auVar24._4_4_ * 0.0;
        fVar54 = auVar20._8_4_ * 0.0 + auVar22._8_4_ * 0.0 + auVar24._8_4_ * 1.0;
        fVar28 = auVar20._12_4_ * 0.0 + auVar22._12_4_ * 0.0 + auVar24._12_4_ * 0.0;
        fVar55 = *(float *)((long)&(pAVar5->l).vx.field_0 + lVar19);
        fVar30 = fVar55 * fVar29 + fVar42 * 0.0 + fVar51 * 0.0;
        fVar34 = fVar55 * fVar37 + fVar43 * 0.0 + fVar53 * 0.0;
        fVar35 = fVar55 * fVar40 + fVar47 * 0.0 + fVar54 * 0.0;
        fVar36 = fVar55 * fVar41 + fVar48 * 0.0 + fVar28 * 0.0;
        fVar55 = *(float *)((long)&(pAVar5->l).vy.field_0 + lVar19);
        fVar23 = *(float *)((long)&(pAVar5->l).vy.field_0 + lVar19 + 4);
        fVar59 = fVar55 * fVar29 + fVar23 * fVar42 + fVar51 * 0.0;
        fVar60 = fVar55 * fVar37 + fVar23 * fVar43 + fVar53 * 0.0;
        fVar61 = fVar55 * fVar40 + fVar23 * fVar47 + fVar54 * 0.0;
        fVar62 = fVar55 * fVar41 + fVar23 * fVar48 + fVar28 * 0.0;
        fVar55 = *(float *)((long)&(pAVar5->l).vz.field_0 + lVar19 + 4);
        fVar23 = *(float *)((long)&(pAVar5->l).vz.field_0 + lVar19 + 8);
        fVar27 = *(float *)((long)&(pAVar5->l).vz.field_0 + lVar19);
        fVar63 = fVar27 * fVar29 + fVar42 * fVar55 + fVar23 * fVar51;
        fVar65 = fVar27 * fVar37 + fVar43 * fVar55 + fVar23 * fVar53;
        fVar66 = fVar27 * fVar40 + fVar47 * fVar55 + fVar23 * fVar54;
        fVar67 = fVar27 * fVar41 + fVar48 * fVar55 + fVar23 * fVar28;
        fVar55 = *(float *)((long)&(pAVar5->p).field_0 + lVar19 + 8);
        fVar23 = *(float *)((long)&(pAVar5->p).field_0 + lVar19 + 4);
        fVar27 = *(float *)((long)&(pAVar5->p).field_0 + lVar19);
        auVar20 = vshufps_avx(*(undefined1 (*) [16])((long)&(pAVar5->l).vx.field_0 + lVar19),
                              ZEXT816(0) << 0x20,0xe9);
        auVar20 = vblendps_avx(auVar20,*(undefined1 (*) [16])
                                        ((long)&(pAVar5->l).vy.field_0 + lVar19),4);
        fVar51 = auVar20._0_4_ + 0.0 + fVar27 * fVar29 + fVar23 * fVar42 + fVar55 * fVar51;
        fVar53 = auVar20._4_4_ + 0.0 + fVar27 * fVar37 + fVar23 * fVar43 + fVar55 * fVar53;
        fVar54 = auVar20._8_4_ + 0.0 + fVar27 * fVar40 + fVar23 * fVar47 + fVar55 * fVar54;
        fVar55 = auVar20._12_4_ + 0.0 + fVar27 * fVar41 + fVar23 * fVar48 + fVar55 * fVar28;
      }
      else {
        pfVar2 = (float *)((long)&(pAVar5->l).vx.field_0 + lVar19);
        fVar30 = *pfVar2;
        fVar34 = pfVar2[1];
        fVar35 = pfVar2[2];
        fVar36 = pfVar2[3];
        pfVar2 = (float *)((long)&(pAVar5->l).vy.field_0 + lVar19);
        fVar59 = *pfVar2;
        fVar60 = pfVar2[1];
        fVar61 = pfVar2[2];
        fVar62 = pfVar2[3];
        pfVar2 = (float *)((long)&(pAVar5->l).vz.field_0 + lVar19);
        fVar63 = *pfVar2;
        fVar65 = pfVar2[1];
        fVar66 = pfVar2[2];
        fVar67 = pfVar2[3];
        pfVar2 = (float *)((long)&(pAVar5->p).field_0 + lVar19);
        fVar51 = *pfVar2;
        fVar53 = pfVar2[1];
        fVar54 = pfVar2[2];
        fVar55 = pfVar2[3];
      }
      fVar23 = ((float)(int)uVar14 *
               ((this->super_Instance).super_Geometry.time_range.upper - fVar13)) /
               geom_time_segments + fVar13;
      auVar20 = vshufps_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),0);
      auVar22 = vshufps_avx(ZEXT416((uint)(1.0 - fVar23)),ZEXT416((uint)(1.0 - fVar23)),0);
      auVar25._0_4_ =
           auVar20._0_4_ * *(float *)(lVar6 + 0x30) + auVar22._0_4_ * *(float *)(lVar6 + 0x10);
      auVar25._4_4_ =
           auVar20._4_4_ * *(float *)(lVar6 + 0x34) + auVar22._4_4_ * *(float *)(lVar6 + 0x14);
      auVar25._8_4_ =
           auVar20._8_4_ * *(float *)(lVar6 + 0x38) + auVar22._8_4_ * *(float *)(lVar6 + 0x18);
      auVar25._12_4_ =
           auVar20._12_4_ * *(float *)(lVar6 + 0x3c) + auVar22._12_4_ * *(float *)(lVar6 + 0x1c);
      auVar31._0_4_ =
           auVar20._0_4_ * *(float *)(lVar6 + 0x40) + auVar22._0_4_ * *(float *)(lVar6 + 0x20);
      auVar31._4_4_ =
           auVar20._4_4_ * *(float *)(lVar6 + 0x44) + auVar22._4_4_ * *(float *)(lVar6 + 0x24);
      auVar31._8_4_ =
           auVar20._8_4_ * *(float *)(lVar6 + 0x48) + auVar22._8_4_ * *(float *)(lVar6 + 0x28);
      auVar31._12_4_ =
           auVar20._12_4_ * *(float *)(lVar6 + 0x4c) + auVar22._12_4_ * *(float *)(lVar6 + 0x2c);
      auVar20 = vshufps_avx(auVar25,auVar25,0);
      auVar22 = vshufps_avx(auVar25,auVar25,0x55);
      auVar24 = vshufps_avx(auVar25,auVar25,0xaa);
      fVar23 = fVar51 + fVar63 * auVar24._0_4_;
      fVar27 = fVar53 + fVar65 * auVar24._4_4_;
      fVar28 = fVar54 + fVar66 * auVar24._8_4_;
      fVar29 = fVar55 + fVar67 * auVar24._12_4_;
      fVar68 = fVar59 * auVar22._0_4_;
      fVar71 = fVar60 * auVar22._4_4_;
      fVar72 = fVar61 * auVar22._8_4_;
      fVar73 = fVar62 * auVar22._12_4_;
      fVar43 = fVar68 + fVar23;
      fVar47 = fVar71 + fVar27;
      fVar48 = fVar72 + fVar28;
      fVar49 = fVar73 + fVar29;
      fVar37 = fVar30 * auVar20._0_4_;
      fVar40 = fVar34 * auVar20._4_4_;
      fVar41 = fVar35 * auVar20._8_4_;
      fVar42 = fVar36 * auVar20._12_4_;
      auVar50._0_4_ = fVar37 + fVar43;
      auVar50._4_4_ = fVar40 + fVar47;
      auVar50._8_4_ = fVar41 + fVar48;
      auVar50._12_4_ = fVar42 + fVar49;
      auVar24 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar64._8_4_ = 0x7f800000;
      auVar64._0_8_ = 0x7f8000007f800000;
      auVar64._12_4_ = 0x7f800000;
      auVar22 = vminps_avx(auVar64,auVar50);
      auVar56._8_4_ = 0xff800000;
      auVar56._0_8_ = 0xff800000ff800000;
      auVar56._12_4_ = 0xff800000;
      auVar20 = vmaxps_avx(auVar56,auVar50);
      fVar51 = fVar51 + fVar63 * auVar24._0_4_;
      fVar53 = fVar53 + fVar65 * auVar24._4_4_;
      fVar54 = fVar54 + fVar66 * auVar24._8_4_;
      fVar55 = fVar55 + fVar67 * auVar24._12_4_;
      fVar68 = fVar68 + fVar51;
      fVar71 = fVar71 + fVar53;
      fVar72 = fVar72 + fVar54;
      fVar73 = fVar73 + fVar55;
      auVar69._0_4_ = fVar68 + fVar37;
      auVar69._4_4_ = fVar71 + fVar40;
      auVar69._8_4_ = fVar72 + fVar41;
      auVar69._12_4_ = fVar73 + fVar42;
      auVar22 = vminps_avx(auVar22,auVar69);
      auVar20 = vmaxps_avx(auVar20,auVar69);
      auVar24 = vshufps_avx(auVar31,auVar31,0x55);
      fVar59 = fVar59 * auVar24._0_4_;
      fVar60 = fVar60 * auVar24._4_4_;
      fVar61 = fVar61 * auVar24._8_4_;
      fVar62 = fVar62 * auVar24._12_4_;
      fVar23 = fVar59 + fVar23;
      fVar27 = fVar60 + fVar27;
      fVar28 = fVar61 + fVar28;
      fVar29 = fVar62 + fVar29;
      auVar70._0_4_ = fVar37 + fVar23;
      auVar70._4_4_ = fVar40 + fVar27;
      auVar70._8_4_ = fVar41 + fVar28;
      auVar70._12_4_ = fVar42 + fVar29;
      auVar22 = vminps_avx(auVar22,auVar70);
      auVar20 = vmaxps_avx(auVar20,auVar70);
      fVar59 = fVar59 + fVar51;
      fVar60 = fVar60 + fVar53;
      fVar61 = fVar61 + fVar54;
      fVar62 = fVar62 + fVar55;
      auVar38._0_4_ = fVar59 + fVar37;
      auVar38._4_4_ = fVar60 + fVar40;
      auVar38._8_4_ = fVar61 + fVar41;
      auVar38._12_4_ = fVar62 + fVar42;
      auVar22 = vminps_avx(auVar22,auVar38);
      auVar20 = vmaxps_avx(auVar20,auVar38);
      auVar24 = vshufps_avx(auVar31,auVar31,0);
      fVar30 = fVar30 * auVar24._0_4_;
      fVar34 = fVar34 * auVar24._4_4_;
      fVar35 = fVar35 * auVar24._8_4_;
      fVar36 = fVar36 * auVar24._12_4_;
      auVar44._0_4_ = fVar30 + fVar43;
      auVar44._4_4_ = fVar34 + fVar47;
      auVar44._8_4_ = fVar35 + fVar48;
      auVar44._12_4_ = fVar36 + fVar49;
      auVar22 = vminps_avx(auVar22,auVar44);
      auVar20 = vmaxps_avx(auVar20,auVar44);
      auVar45._0_4_ = fVar68 + fVar30;
      auVar45._4_4_ = fVar71 + fVar34;
      auVar45._8_4_ = fVar72 + fVar35;
      auVar45._12_4_ = fVar73 + fVar36;
      auVar22 = vminps_avx(auVar22,auVar45);
      auVar20 = vmaxps_avx(auVar20,auVar45);
      auVar26._0_4_ = fVar30 + fVar23;
      auVar26._4_4_ = fVar34 + fVar27;
      auVar26._8_4_ = fVar35 + fVar28;
      auVar26._12_4_ = fVar36 + fVar29;
      auVar22 = vminps_avx(auVar22,auVar26);
      auVar20 = vmaxps_avx(auVar20,auVar26);
      auVar32._0_4_ = fVar59 + fVar30;
      auVar32._4_4_ = fVar60 + fVar34;
      auVar32._8_4_ = fVar61 + fVar35;
      auVar32._12_4_ = fVar62 + fVar36;
      auVar24 = vminps_avx(auVar22,auVar32);
      auVar22 = vmaxps_avx(auVar20,auVar32);
      auVar33._8_4_ = 0xddccb9a2;
      auVar33._0_8_ = 0xddccb9a2ddccb9a2;
      auVar33._12_4_ = 0xddccb9a2;
      auVar20 = vcmpps_avx(auVar24,auVar33,6);
      auVar22 = vcmpps_avx(auVar22,auVar58,1);
      auVar20 = vandps_avx(auVar22,auVar20);
      uVar15 = vmovmskps_avx(auVar20);
      if ((~(byte)uVar15 & 7) != 0) {
        if (!bVar18) {
          return __return_storage_ptr__;
        }
        break;
      }
      uVar17 = uVar17 + 1;
      uVar14 = uVar14 + 1;
      lVar19 = lVar19 + 0x40;
      bVar18 = (ulong)(long)(int)uVar16 < uVar17;
    } while (uVar17 <= (ulong)(long)(int)uVar16);
  }
  Instance::nonlinearBounds
            ((LBBox3fa *)&local_78.field_1,&this->super_Instance,t0t1,
             &(this->super_Instance).super_Geometry.time_range,geom_time_segments);
  uVar14 = (this->super_Instance).super_Geometry.numTimeSteps - 1;
  BVar4 = (this->super_Instance).super_Geometry.time_range;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = BVar4.lower;
  auVar21._4_4_ = BVar4.upper;
  aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
          vinsertps_avx((undefined1  [16])local_78,ZEXT416(geomID),0x30);
  aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
          vblendps_avx(ZEXT816(0) << 0x40,local_68,7);
  aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
           vinsertps_avx(local_58,ZEXT416(uVar14),0x30);
  aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
           vinsertps_avx(local_48,ZEXT416(uVar14),0x30);
  auVar46._0_4_ = aVar9.x * 0.5 + aVar10.x * 0.5 + aVar11.x * 0.5 + aVar8.x * 0.5;
  auVar46._4_4_ = aVar9.y * 0.5 + aVar10.y * 0.5 + aVar11.y * 0.5 + aVar8.y * 0.5;
  auVar46._8_4_ = aVar9.z * 0.5 + aVar10.z * 0.5 + aVar11.z * 0.5 + aVar8.z * 0.5;
  auVar46._12_4_ =
       aVar9.field_3.w * 0.5 + aVar10.field_3.w * 0.5 +
       aVar11.field_3.w * 0.5 + aVar8.field_3.w * 0.5;
  auVar52._8_4_ = 0x7f800000;
  auVar52._0_8_ = 0x7f8000007f800000;
  auVar52._12_4_ = 0x7f800000;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar52,(undefined1  [16])aVar9);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar12;
  auVar57._8_4_ = 0xff800000;
  auVar57._0_8_ = 0xff800000ff800000;
  auVar57._12_4_ = 0xff800000;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar57,(undefined1  [16])aVar8);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar12;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar52,(undefined1  [16])aVar10);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar12;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar57,(undefined1  [16])aVar11);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar12;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vminps_avx(auVar52,auVar46);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar12;
  aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vmaxps_avx(auVar57,auVar46);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar12;
  auVar20 = vcmpps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar21,1);
  auVar22 = vinsertps_avx(SUB6416(ZEXT464(0x3f800000),0),auVar21,0x5c);
  auVar39._4_12_ = ZEXT812(0) << 0x20;
  auVar39._0_4_ = BVar4.lower;
  auVar20 = vblendvps_avx(auVar39,auVar22,auVar20);
  BVar4 = (BBox1f)vmovlps_avx(auVar20);
  __return_storage_ptr__->time_range = BVar4;
  puVar1 = &(__return_storage_ptr__->object_range)._end;
  *puVar1 = *puVar1 + 1;
  __return_storage_ptr__->num_time_segments = (ulong)uVar14;
  if (uVar14 != 0) {
    __return_storage_ptr__->max_num_time_segments = (ulong)uVar14;
    BVar4 = (BBox1f)vmovlps_avx(auVar21);
    __return_storage_ptr__->max_time_range = BVar4;
  }
  pPVar7 = prims->items;
  pPVar7[k].lbounds.bounds0.lower.field_0.field_1 = aVar9;
  pPVar7[k].lbounds.bounds0.upper.field_0.field_1 = aVar8;
  pPVar7[k].lbounds.bounds1.lower.field_0.field_1 = aVar10;
  pPVar7[k].lbounds.bounds1.upper.field_0.field_1 = aVar11;
  BVar4 = (BBox1f)vmovlps_avx(auVar21);
  pPVar7[k].time_range = BVar4;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        assert(r.begin() == 0);
        assert(r.end()   == 1);

        PrimInfoMB pinfo(empty);
        if (!valid(0, timeSegmentRange(t0t1))) return pinfo;
        const PrimRefMB prim(linearBounds(0,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(0));
        pinfo.add_primref(prim);
        prims[k++] = prim;
        return pinfo;
      }